

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

string * __thiscall duckdb::Vector::ToString_abi_cxx11_(string *__return_storage_ptr__,Vector *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  VectorType VVar3;
  long lVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  size_type *psVar8;
  VectorType in_DL;
  undefined8 uVar9;
  string local_c0;
  string local_a0;
  Value local_80;
  string local_40;
  
  VectorTypeToString_abi_cxx11_(&local_40,(duckdb *)(ulong)this->vector_type,in_DL);
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_40);
  paVar2 = &local_c0.field_2;
  puVar7 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_c0.field_2._M_allocated_capacity = *puVar7;
    local_c0.field_2._8_8_ = plVar5[3];
    local_c0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *puVar7;
    local_c0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_c0._M_string_length = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  LogicalType::ToString_abi_cxx11_(&local_a0,&this->type);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    uVar9 = local_c0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_a0._M_string_length + local_c0._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      uVar9 = local_a0.field_2._M_allocated_capacity;
    }
    if (local_a0._M_string_length + local_c0._M_string_length <= (ulong)uVar9) {
      puVar6 = (undefined8 *)
               ::std::__cxx11::string::replace
                         ((ulong)&local_a0,0,(char *)0x0,(ulong)local_c0._M_dataplus._M_p);
      goto LAB_002e30ed;
    }
  }
  puVar6 = (undefined8 *)
           ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_a0._M_dataplus._M_p);
LAB_002e30ed:
  local_80.type_._0_8_ =
       &local_80.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar6 + 2);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*puVar6 == p_Var1) {
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var1->_M_pi;
    local_80._24_8_ = puVar6[3];
  }
  else {
    local_80.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var1->_M_pi;
    local_80.type_._0_8_ = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)*puVar6;
  }
  local_80.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)puVar6[1];
  *puVar6 = p_Var1;
  puVar6[1] = 0;
  *(undefined1 *)&p_Var1->_M_pi = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_80);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar8) {
    lVar4 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_80.type_._0_8_ !=
      &local_80.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete((void *)local_80.type_._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  VVar3 = this->vector_type;
  if ((1 < VVar3 - 3) && (VVar3 != FLAT_VECTOR)) {
    if (VVar3 == CONSTANT_VECTOR) {
      GetValue(&local_80,this,0);
      Value::ToString_abi_cxx11_(&local_c0,&local_80);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      Value::~Value(&local_80);
    }
    else {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string Vector::ToString() const {
	string retval = VectorTypeToString(GetVectorType()) + " " + GetType().ToString() + ": (UNKNOWN COUNT) [ ";
	switch (GetVectorType()) {
	case VectorType::FLAT_VECTOR:
	case VectorType::DICTIONARY_VECTOR:
		break;
	case VectorType::CONSTANT_VECTOR:
		retval += GetValue(0).ToString();
		break;
	case VectorType::SEQUENCE_VECTOR: {
		break;
	}
	default:
		retval += "UNKNOWN VECTOR TYPE";
		break;
	}
	retval += "]";
	return retval;
}